

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Vector * MulInv_QV(QMatrix *Q,Vector *V)

{
  double dVar1;
  double dVar2;
  ulong Dim_00;
  size_t *psVar3;
  ElType **ppEVar4;
  Real *pRVar5;
  Real *pRVar6;
  Real *pRVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ElType *pEVar13;
  LASErrIdType LVar14;
  char *pcVar15;
  size_t sVar16;
  size_t sVar17;
  char *pcVar18;
  char *pcVar19;
  bool bVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  Real *VResCmp;
  Real *VCmp;
  Real *QInvDiagEl;
  ElType *PtrEl;
  ElType **QEl;
  Boolean MultiplDVIsOne;
  Boolean MultiplVIsOne;
  Boolean MultiplLIsOne;
  Boolean MultiplUIsOne;
  Boolean MultiplDIsOne;
  Boolean MultiplLIsZero;
  Boolean MultiplUIsZero;
  Boolean MultiplDIsZero;
  size_t *QLen;
  size_t ElCount;
  size_t Len;
  size_t Ind;
  size_t Clm;
  size_t Row;
  size_t Dim;
  double Cmp;
  double Sum;
  double MultiplDV;
  double MultiplV;
  double MultiplL;
  double MultiplU;
  double MultiplD;
  char *VResName;
  Vector *VRes;
  Vector *V_local;
  QMatrix *Q_local;
  
  Q_Lock(Q);
  V_Lock(V);
  LVar14 = LASResult();
  if (LVar14 == LASOK) {
    if (Q->Dim == V->Dim) {
      Dim_00 = V->Dim;
      VResName = (char *)malloc(0x30);
      pcVar15 = Q_GetName(Q);
      sVar16 = strlen(pcVar15);
      pcVar15 = V_GetName(V);
      sVar17 = strlen(pcVar15);
      pcVar15 = (char *)malloc(sVar16 + sVar17 + 0x14);
      if (((Vector *)VResName == (Vector *)0x0) || (pcVar15 == (char *)0x0)) {
        pcVar18 = Q_GetName(Q);
        pcVar19 = V_GetName(V);
        LASError(LASMemAllocErr,"MulInv_QV",pcVar18,pcVar19,(char *)0x0);
        if ((Vector *)VResName != (Vector *)0x0) {
          free(VResName);
        }
      }
      else {
        pcVar18 = Q_GetName(Q);
        pcVar19 = V_GetName(V);
        sprintf(pcVar15,"(%s)^(-1) * (%s)",pcVar18,pcVar19);
        V_Constr((Vector *)VResName,pcVar15,Dim_00,Tempor,True);
        Q_SortEl(Q);
        Q_AllocInvDiagEl(Q);
        LVar14 = LASResult();
        if ((((LVar14 != LASOK) || (*Q->ElSorted == False)) || (*Q->ZeroInDiag != False)) ||
           (ABS(Q->MultiplD) < 2.2250738585072014e-307)) {
          LVar14 = LASResult();
          if ((LVar14 == LASOK) && (*Q->ElSorted == False)) {
            pcVar18 = Q_GetName(Q);
            pcVar19 = V_GetName(V);
            LASError(LASElNotSortedErr,"MulInv_QV",pcVar18,pcVar19,(char *)0x0);
          }
          LVar14 = LASResult();
          if ((LVar14 == LASOK) &&
             ((*Q->ZeroInDiag != False || (ABS(Q->MultiplD) < 2.2250738585072014e-307)))) {
            pcVar18 = Q_GetName(Q);
            pcVar19 = V_GetName(V);
            LASError(LASZeroInDiagErr,"MulInv_QV",pcVar18,pcVar19,(char *)0x0);
          }
        }
        else {
          psVar3 = Q->Len;
          ppEVar4 = Q->El;
          pRVar5 = Q->InvDiagEl;
          pRVar6 = V->Cmp;
          pRVar7 = ((Vector *)VResName)->Cmp;
          if ((Q->Symmetry != False) || (Q->ElOrder == Clmws)) {
            V_SetAllCmp((Vector *)VResName,0.0);
          }
          dVar22 = 1.0 / Q->MultiplD;
          dVar24 = Q->MultiplU;
          dVar1 = Q->MultiplL;
          dVar2 = V->Multipl;
          dVar23 = V->Multipl / Q->MultiplD;
          bVar8 = ABS(dVar24) < 2.2250738585072014e-307;
          bVar9 = ABS(dVar1) < 2.2250738585072014e-307;
          bVar10 = 2.220446049250313e-15 <= ABS(dVar22 - 1.0);
          bVar21 = 2.220446049250313e-15 <= ABS(dVar24 - 1.0);
          bVar11 = 2.220446049250313e-15 <= ABS(dVar1 - 1.0);
          bVar12 = 2.220446049250313e-15 <= ABS(dVar2 - 1.0);
          if (((2.2250738585072014e-307 <= ABS(dVar22)) && (bVar8)) && (bVar9)) {
            if (2.220446049250313e-15 <= ABS(dVar23 - 1.0)) {
              for (Len = 1; Len <= Dim_00; Len = Len + 1) {
                pRVar7[Len] = dVar23 * pRVar6[Len] * pRVar5[Len];
              }
            }
            else {
              for (Len = 1; Len <= Dim_00; Len = Len + 1) {
                pRVar7[Len] = pRVar6[Len] * pRVar5[Len];
              }
            }
          }
          if ((!bVar8) && (bVar9)) {
            Clm = Dim_00;
            if (((Q->Symmetry == False) && (Q->ElOrder == Rowws)) ||
               ((Q->Symmetry != False && (Q->ElOrder == Rowws)))) {
              for (; Clm != 0; Clm = Clm - 1) {
                QLen = (size_t *)psVar3[Clm];
                Cmp = 0.0;
                pEVar13 = ppEVar4[Clm] + (long)QLen;
                while( true ) {
                  QInvDiagEl = (Real *)(pEVar13 + -1);
                  bVar20 = false;
                  if (QLen != (size_t *)0x0) {
                    bVar20 = Clm < (ulong)*QInvDiagEl;
                  }
                  if (!bVar20) break;
                  Cmp = -pEVar13[-1].Val * pRVar7[(long)*QInvDiagEl] + Cmp;
                  QLen = (size_t *)((long)QLen + -1);
                  pEVar13 = (ElType *)QInvDiagEl;
                }
                if (bVar21) {
                  Cmp = dVar24 * Cmp;
                }
                if (bVar12) {
                  dVar23 = dVar2 * pRVar6[Clm];
                }
                else {
                  dVar23 = pRVar6[Clm];
                }
                Cmp = dVar23 + Cmp;
                if (bVar10) {
                  pRVar7[Clm] = Cmp * dVar22 * pRVar5[Clm];
                }
                else {
                  pRVar7[Clm] = Cmp * pRVar5[Clm];
                }
              }
            }
            Ind = Dim_00;
            if (((Q->Symmetry == False) && (Q->ElOrder == Clmws)) ||
               ((Q->Symmetry != False && (Q->ElOrder == Clmws)))) {
              for (; Ind != 0; Ind = Ind - 1) {
                Cmp = pRVar7[Ind];
                if (bVar21) {
                  Cmp = dVar24 * Cmp;
                }
                if (bVar12) {
                  dVar23 = dVar2 * pRVar6[Ind];
                }
                else {
                  dVar23 = pRVar6[Ind];
                }
                Cmp = dVar23 + Cmp;
                if (bVar10) {
                  Dim = (size_t)(Cmp * dVar22 * pRVar5[Ind]);
                }
                else {
                  Dim = (size_t)(Cmp * pRVar5[Ind]);
                }
                pRVar7[Ind] = (Real)Dim;
                QLen = (size_t *)psVar3[Ind];
                QInvDiagEl = (Real *)ppEVar4[Ind];
                while( true ) {
                  bVar20 = false;
                  if (QLen != (size_t *)0x0) {
                    bVar20 = (ulong)*QInvDiagEl < Ind;
                  }
                  if (!bVar20) break;
                  pRVar7[(long)*QInvDiagEl] =
                       -QInvDiagEl[1] * (double)Dim + pRVar7[(long)*QInvDiagEl];
                  QInvDiagEl = QInvDiagEl + 2;
                  QLen = (size_t *)((long)QLen + -1);
                }
              }
            }
          }
          if ((bVar8) && (!bVar9)) {
            if (((Q->Symmetry == False) && (Q->ElOrder == Rowws)) ||
               ((Q->Symmetry != False && (Q->ElOrder == Clmws)))) {
              for (Clm = 1; Clm <= Dim_00; Clm = Clm + 1) {
                QLen = (size_t *)psVar3[Clm];
                QInvDiagEl = (Real *)ppEVar4[Clm];
                Cmp = 0.0;
                while( true ) {
                  bVar21 = false;
                  if (QLen != (size_t *)0x0) {
                    bVar21 = (ulong)*QInvDiagEl < Clm;
                  }
                  if (!bVar21) break;
                  Cmp = -QInvDiagEl[1] * pRVar7[(long)*QInvDiagEl] + Cmp;
                  QInvDiagEl = QInvDiagEl + 2;
                  QLen = (size_t *)((long)QLen + -1);
                }
                if (bVar11) {
                  Cmp = dVar1 * Cmp;
                }
                if (bVar12) {
                  dVar24 = dVar2 * pRVar6[Clm];
                }
                else {
                  dVar24 = pRVar6[Clm];
                }
                Cmp = dVar24 + Cmp;
                if (bVar10) {
                  pRVar7[Clm] = Cmp * dVar22 * pRVar5[Clm];
                }
                else {
                  pRVar7[Clm] = Cmp * pRVar5[Clm];
                }
              }
            }
            if (((Q->Symmetry == False) && (Q->ElOrder == Clmws)) ||
               ((Q->Symmetry != False && (Q->ElOrder == Rowws)))) {
              for (Ind = 1; Ind <= Dim_00; Ind = Ind + 1) {
                Cmp = pRVar7[Ind];
                if (bVar11) {
                  Cmp = dVar1 * Cmp;
                }
                if (bVar12) {
                  dVar24 = dVar2 * pRVar6[Ind];
                }
                else {
                  dVar24 = pRVar6[Ind];
                }
                Cmp = dVar24 + Cmp;
                if (bVar10) {
                  Dim = (size_t)(Cmp * dVar22 * pRVar5[Ind]);
                }
                else {
                  Dim = (size_t)(Cmp * pRVar5[Ind]);
                }
                pRVar7[Ind] = (Real)Dim;
                QLen = (size_t *)psVar3[Ind];
                pEVar13 = ppEVar4[Ind] + (long)QLen;
                while( true ) {
                  QInvDiagEl = (Real *)(pEVar13 + -1);
                  bVar21 = false;
                  if (QLen != (size_t *)0x0) {
                    bVar21 = Ind < (ulong)*QInvDiagEl;
                  }
                  if (!bVar21) break;
                  pRVar7[(long)*QInvDiagEl] =
                       -pEVar13[-1].Val * (double)Dim + pRVar7[(long)*QInvDiagEl];
                  QLen = (size_t *)((long)QLen + -1);
                  pEVar13 = (ElType *)QInvDiagEl;
                }
              }
            }
          }
          if ((!bVar8) && (!bVar9)) {
            pcVar18 = Q_GetName(Q);
            pcVar19 = V_GetName(V);
            LASError(LASMulInvErr,"MulInv_QV",pcVar18,pcVar19,(char *)0x0);
          }
        }
      }
      if (pcVar15 != (char *)0x0) {
        free(pcVar15);
      }
    }
    else {
      pcVar15 = Q_GetName(Q);
      pcVar18 = V_GetName(V);
      LASError(LASDimErr,"MulInv_QV",pcVar15,pcVar18,(char *)0x0);
      VResName = (char *)0x0;
    }
  }
  else {
    VResName = (char *)0x0;
  }
  Q_Unlock(Q);
  V_Unlock(V);
  return (Vector *)VResName;
}

Assistant:

Vector *MulInv_QV(QMatrix *Q, Vector *V)
/* VRes = Q^(-1) * V, this operation is limited to diagonal or triangular
   matrices */
{
    Vector *VRes;

    char *VResName;
    double MultiplD, MultiplU, MultiplL, MultiplV, MultiplDV;
    double Sum, Cmp;
    size_t Dim, Row, Clm, Ind, Len, ElCount;
    size_t *QLen;
    Boolean MultiplDIsZero, MultiplUIsZero, MultiplLIsZero;
    Boolean MultiplDIsOne, MultiplUIsOne, MultiplLIsOne, MultiplVIsOne,
        MultiplDVIsOne;
    ElType **QEl, *PtrEl;
    Real *QInvDiagEl;
    Real *VCmp, *VResCmp;

    Q_Lock(Q);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->Dim == V->Dim) {
            Dim = V->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(Q_GetName(Q)) + strlen(V_GetName(V)) + 20)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s)^(-1) * (%s)", Q_GetName(Q), V_GetName(V));
                V_Constr(VRes, VResName, Dim, Tempor, True);

                /* sort of elements and allocation of the inverse of diagonal elements
                   of the matrix Q */
                Q_SortEl(Q);
                Q_AllocInvDiagEl(Q);

                if (LASResult() == LASOK && *Q->ElSorted && !(*Q->ZeroInDiag)
                    && !IsZero(Q->MultiplD)) {
                    /* assignment of auxiliary lokal variables */
                    QLen = Q->Len;
                    QEl = Q->El;
                    QInvDiagEl = Q->InvDiagEl;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (Q->Symmetry || Q->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the lower, diagonal and upper part
                       of the matrix Q and of the vector V */
                    MultiplD = 1.0 / Q->MultiplD;  /* attention here !!! */
                    MultiplU = Q->MultiplU;
                    MultiplL = Q->MultiplL;
                    MultiplV = V->Multipl;
                    MultiplDV = V->Multipl / Q->MultiplD;  /* attention here !!! */
                    MultiplDIsZero = IsZero(MultiplD);
                    MultiplUIsZero = IsZero(MultiplU);
                    MultiplLIsZero = IsZero(MultiplL);
                    MultiplDIsOne = IsOne(MultiplD);
                    MultiplUIsOne = IsOne(MultiplU);
                    MultiplLIsOne = IsOne(MultiplL);
                    MultiplVIsOne = IsOne(MultiplV);
                    MultiplDVIsOne = IsOne(MultiplDV);

                    /* multiplication of the vector V by the inverse matrix
                       of the diagonal of M */
                    if (!MultiplDIsZero && MultiplUIsZero && MultiplLIsZero) {
                        if (MultiplDVIsOne) {
                           for_AllCmp
                                VResCmp[Ind] = VCmp[Ind] * QInvDiagEl[Ind];
                        } else {
                           for_AllCmp
                                VResCmp[Ind] = MultiplDV * VCmp[Ind] * QInvDiagEl[Ind];
                        }
                    }

                    /* multiplication of the vector V by the inverse matrix
                       of the upper triangular part of M */
                    if (!MultiplUIsZero && MultiplLIsZero) {
                        if ((!Q->Symmetry && Q->ElOrder == Rowws)
                            || (Q->Symmetry && Q->ElOrder == Rowws)) {
                            for (Row = Dim; Row >= 1; Row--) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row] + Len - 1;
                                Sum = 0.0;
                                  for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Row;
                                    ElCount--) {
                                    Sum -= (*PtrEl).Val * VResCmp[(*PtrEl).Pos];
                                    PtrEl--;
                                }
                                if (!MultiplUIsOne)
                                    Sum *= MultiplU;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Row];
                                else
                                    Sum += MultiplV * VCmp[Row];
                                if (MultiplDIsOne) {
                                    VResCmp[Row] = Sum * QInvDiagEl[Row];
                                } else {
                                    VResCmp[Row] = Sum * MultiplD * QInvDiagEl[Row];
                                }
                            }
                        }
                        if ((!Q->Symmetry && Q->ElOrder == Clmws)
                            || (Q->Symmetry && Q->ElOrder == Clmws)) {
                            for (Clm = Dim; Clm >= 1; Clm--) {
                                Sum = VResCmp[Clm];
                                if (!MultiplUIsOne)
                                    Sum *= MultiplU;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Clm];
                                else
                                    Sum += MultiplV * VCmp[Clm];
                                if (MultiplDIsOne) {
                                    Cmp = Sum * QInvDiagEl[Clm];
                                } else {
                                    Cmp = Sum * MultiplD * QInvDiagEl[Clm];
                                }
                                VResCmp[Clm] = Cmp;

                                Len = QLen[Clm];
                                PtrEl = QEl[Clm];
                                for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Clm;
                                    ElCount--) {
                                    VResCmp[(*PtrEl).Pos] -= (*PtrEl).Val * Cmp;
                                    PtrEl++;
                                }
                            }
                        }
                    }

                    /* multiplication of the vector V by the inverse matrix 
                       of the lower triangular part of M */
                    if (MultiplUIsZero && !MultiplLIsZero) {
                        if ((!Q->Symmetry && Q->ElOrder == Rowws)
                            || (Q->Symmetry && Q->ElOrder == Clmws)) {
                            for (Row = 1; Row <= Dim; Row++) {
                                Len = QLen[Row];
                                PtrEl = QEl[Row];
                                Sum = 0.0;
                                       for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos < Row;
                                    ElCount--) {
                                    Sum -= (*PtrEl).Val * VResCmp[(*PtrEl).Pos];
                                    PtrEl++;
                                }
                                if (!MultiplLIsOne)
                                    Sum *= MultiplL;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Row];
                                else
                                    Sum += MultiplV * VCmp[Row];
                                if (MultiplDIsOne) {
                                    VResCmp[Row] = Sum * QInvDiagEl[Row];
                                } else {
                                    VResCmp[Row] = Sum * MultiplD * QInvDiagEl[Row];
                                }
                            }
                        }
                        if ((!Q->Symmetry && Q->ElOrder == Clmws)
                            || (Q->Symmetry && Q->ElOrder == Rowws)) {
                            for (Clm = 1; Clm <= Dim; Clm++) {
                                Sum = VResCmp[Clm];
                                if (!MultiplLIsOne)
                                    Sum *= MultiplL;
                                if (MultiplVIsOne)
                                    Sum += VCmp[Clm];
                                else
                                    Sum += MultiplV * VCmp[Clm];
                                if (MultiplDIsOne) {
                                    Cmp = Sum * QInvDiagEl[Clm];
                                } else {
                                    Cmp = Sum * MultiplD * QInvDiagEl[Clm];
                                }
                                VResCmp[Clm] = Cmp;

                                Len = QLen[Clm];
                                PtrEl = QEl[Clm] + Len - 1;
                                      for (ElCount = Len; ElCount > 0 && (*PtrEl).Pos > Clm;
                                    ElCount--) {
                                    VResCmp[(*PtrEl).Pos] -= (*PtrEl).Val * Cmp;
                                    PtrEl--;
                                }
                            }
                        }
                    }
                    if (!MultiplUIsZero && !MultiplLIsZero) {
                        LASError(LASMulInvErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                    }
                } else {
                    if (LASResult() == LASOK && !(*Q->ElSorted))
                        LASError(LASElNotSortedErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                    if (LASResult() == LASOK && (*Q->ZeroInDiag || IsZero(Q->MultiplD)))
                        LASError(LASZeroInDiagErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                }
            } else {
                LASError(LASMemAllocErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "MulInv_QV", Q_GetName(Q), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    Q_Unlock(Q);
    V_Unlock(V);

    return(VRes);
}